

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::fail_array32_int64_missing_one(void)

{
  value_type input [12];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_40[0] = 0xce;
  local_40[1] = '\b';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\x11';
  local_40[6] = '\"';
  local_40[7] = '3';
  local_40[8] = 'D';
  local_40[9] = 'U';
  local_40[10] = 'f';
  local_40[0xb] = 'w';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[12]>
            (&local_30,(uchar (*) [12])local_40);
  local_44 = local_30.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xb96,"void compact_int64_suite::fail_array32_int64_missing_one()",&local_44,&local_48
            );
  return;
}

Assistant:

void fail_array32_int64_missing_one()
{
    const value_type input[] = { token::code::array32_int64, 0x08, 0x00, 0x00, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}